

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<const_kj::ReadableDirectory_*> * __thiscall
kj::ArrayBuilder<const_kj::ReadableDirectory_*>::operator=
          (ArrayBuilder<const_kj::ReadableDirectory_*> *this,
          ArrayBuilder<const_kj::ReadableDirectory_*> *other)

{
  ReadableDirectory **ppRVar1;
  RemoveConst<const_kj::ReadableDirectory_*> *ppRVar2;
  ReadableDirectory **ppRVar3;
  ArrayDisposer *pAVar4;
  
  ppRVar1 = this->ptr;
  if (ppRVar1 != (ReadableDirectory **)0x0) {
    ppRVar2 = this->pos;
    ppRVar3 = this->endPtr;
    this->ptr = (ReadableDirectory **)0x0;
    this->pos = (RemoveConst<const_kj::ReadableDirectory_*> *)0x0;
    this->endPtr = (ReadableDirectory **)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppRVar1,8,(long)ppRVar2 - (long)ppRVar1 >> 3,
               (long)ppRVar3 - (long)ppRVar1 >> 3,0);
  }
  ppRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (ReadableDirectory **)0x0;
  other->pos = (RemoveConst<const_kj::ReadableDirectory_*> *)0x0;
  other->endPtr = (ReadableDirectory **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }